

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cookie.c
# Opt level: O3

void mbedtls_ssl_cookie_init(mbedtls_ssl_cookie_ctx *ctx)

{
  mbedtls_md_init(&ctx->hmac_ctx);
  ctx->timeout = 0x3c;
  return;
}

Assistant:

void mbedtls_ssl_cookie_init( mbedtls_ssl_cookie_ctx *ctx )
{
    mbedtls_md_init( &ctx->hmac_ctx );
#if !defined(MBEDTLS_HAVE_TIME)
    ctx->serial = 0;
#endif
    ctx->timeout = MBEDTLS_SSL_COOKIE_TIMEOUT;

#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_init( &ctx->mutex );
#endif
}